

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O0

smf_t * smf_new(void)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  GPtrArray *pGVar4;
  smf_t *smf;
  smf_t *psStack_10;
  int cantfail;
  
  psStack_10 = (smf_t *)malloc(0x50);
  if (psStack_10 == (smf_t *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    g_log("libsmf",8,"Cannot allocate smf_t structure: %s",pcVar3);
    psStack_10 = (smf_t *)0x0;
  }
  else {
    memset(psStack_10,0,0x50);
    pGVar4 = (GPtrArray *)g_ptr_array_new();
    psStack_10->tracks_array = pGVar4;
    if (psStack_10->tracks_array == (GPtrArray *)0x0) {
      __assert_fail("smf->tracks_array",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                    ,0x3f,"smf_t *smf_new(void)");
    }
    pGVar4 = (GPtrArray *)g_ptr_array_new();
    psStack_10->tempo_array = pGVar4;
    if (psStack_10->tempo_array == (GPtrArray *)0x0) {
      __assert_fail("smf->tempo_array",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                    ,0x42,"smf_t *smf_new(void)");
    }
    iVar1 = smf_set_ppqn(psStack_10,0x78);
    if (iVar1 != 0) {
      __assert_fail("!cantfail",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                    ,0x45,"smf_t *smf_new(void)");
    }
    iVar1 = smf_set_format(psStack_10,0);
    if (iVar1 != 0) {
      __assert_fail("!cantfail",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                    ,0x48,"smf_t *smf_new(void)");
    }
    smf_init_tempo(psStack_10);
  }
  return psStack_10;
}

Assistant:

smf_t *
smf_new(void)
{
	int cantfail;

	smf_t *smf = malloc(sizeof(smf_t));
	if (smf == NULL) {
		g_critical("Cannot allocate smf_t structure: %s", strerror(errno));
		return (NULL);
	}

	memset(smf, 0, sizeof(smf_t));

	smf->tracks_array = g_ptr_array_new();
	assert(smf->tracks_array);

	smf->tempo_array = g_ptr_array_new();
	assert(smf->tempo_array);

	cantfail = smf_set_ppqn(smf, 120);
	assert(!cantfail);

	cantfail = smf_set_format(smf, 0);
	assert(!cantfail);

	smf_init_tempo(smf);

	return (smf);
}